

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatImage.cpp
# Opt level: O3

float __thiscall nv::FloatImage::sampleLinearClamp(FloatImage *this,float x,float y,int c)

{
  ushort uVar1;
  ushort uVar2;
  float *pfVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  uVar1 = this->m_width;
  uVar2 = this->m_height;
  fVar12 = x * (float)uVar1;
  fVar15 = (float)uVar2 * y;
  fVar13 = floorf(fVar12);
  fVar12 = fVar12 - fVar13;
  fVar14 = floorf(fVar15);
  uVar10 = (uint)fVar13;
  fVar15 = fVar15 - fVar14;
  uVar9 = (uint)fVar14;
  uVar5 = 0;
  if (0 < (int)uVar9) {
    uVar5 = uVar9;
  }
  if ((int)uVar9 < 0) {
    uVar9 = 0xffffffff;
  }
  uVar4 = 0;
  if (0 < (int)uVar10) {
    uVar4 = uVar10;
  }
  uVar7 = 0xffffffff;
  if (-1 < (int)uVar10) {
    uVar7 = uVar10;
  }
  if (uVar1 <= uVar4) {
    uVar4 = uVar1 - 1;
  }
  if (uVar2 <= uVar5) {
    uVar5 = uVar2 - 1;
  }
  uVar11 = (uint)uVar1;
  uVar10 = uVar7 + 1;
  if (uVar11 <= uVar7 + 1) {
    uVar10 = uVar1 - 1;
  }
  uVar7 = uVar9 + 1;
  if ((uint)uVar2 <= uVar9 + 1) {
    uVar7 = uVar2 - 1;
  }
  pfVar3 = this->m_mem;
  iVar8 = c * (uint)uVar2;
  iVar6 = (uVar5 + iVar8) * uVar11;
  iVar8 = (iVar8 + uVar7) * uVar11;
  return ((1.0 - fVar12) * pfVar3[uVar4 + iVar8] + fVar12 * pfVar3[iVar8 + uVar10]) * fVar15 +
         (1.0 - fVar15) * (pfVar3[iVar6 + uVar4] * (1.0 - fVar12) + pfVar3[iVar6 + uVar10] * fVar12)
  ;
}

Assistant:

float FloatImage::sampleLinearClamp(float x, float y, const int c) const
{
	const int w = m_width;
	const int h = m_height;
	
	x *= w;
	y *= h;
	
	const float fracX = frac(x);
	const float fracY = frac(y);
	
	const int ix0 = ::clamp(ifloor(x), 0, w-1);
	const int iy0 = ::clamp(ifloor(y), 0, h-1);
	const int ix1 = ::clamp(ifloor(x)+1, 0, w-1);
	const int iy1 = ::clamp(ifloor(y)+1, 0, h-1);

	float f1 = pixel(ix0, iy0, c);
	float f2 = pixel(ix1, iy0, c);
	float f3 = pixel(ix0, iy1, c);
	float f4 = pixel(ix1, iy1, c);
	
	float i1 = lerp(f1, f2, fracX);
	float i2 = lerp(f3, f4, fracX);

	return lerp(i1, i2, fracY);
}